

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int get_response(mg_connection *conn,char *ebuf,size_t ebuf_len,int *err)

{
  mg_header *hdr;
  byte *pbVar1;
  byte bVar2;
  __int32_t *p_Var3;
  int iVar4;
  uint uVar5;
  ushort **ppuVar6;
  long lVar7;
  __int32_t **pp_Var8;
  byte *pbVar9;
  longlong lVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  char *endptr;
  byte *local_58;
  char *local_50;
  size_t local_48;
  int *local_40;
  char *local_38;
  
  conn->connection_type = 2;
  iVar4 = get_message(conn,ebuf,ebuf_len,err);
  if (iVar4 == 0) {
    return 0;
  }
  pbVar9 = (byte *)conn->buf;
  uVar5 = conn->buf_size;
  uVar11 = 0;
  (conn->response_info).status_code = 0;
  (conn->response_info).num_headers = 0;
  (conn->response_info).status_text = (char *)0x0;
  (conn->response_info).http_version = (char *)0x0;
  local_50 = ebuf;
  local_48 = ebuf_len;
  local_40 = err;
  if (0 < (long)(int)uVar5) {
    local_58 = pbVar9;
    ppuVar6 = __ctype_b_loc();
    uVar11 = 0;
    uVar13 = uVar5;
    do {
      if ((*(byte *)((long)*ppuVar6 + (ulong)pbVar9[uVar11] * 2 + 1) & 0x20) == 0) {
        pbVar9 = pbVar9 + uVar11;
        uVar5 = uVar13;
        goto LAB_001139c8;
      }
      uVar11 = uVar11 + 1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    uVar11 = (ulong)uVar5;
    pbVar9 = pbVar9 + (int)uVar5;
    uVar5 = 0;
  }
LAB_001139c8:
  local_58 = pbVar9;
  if (((uVar5 != 0) && (ppuVar6 = __ctype_b_loc(), ((*ppuVar6)[*pbVar9] & 2) == 0)) &&
     (uVar5 = get_http_header_len((char *)pbVar9,uVar5), 0 < (int)uVar5)) {
    pbVar9[(ulong)uVar5 - 1] = 0;
    if (((0xd < *pbVar9) || ((0x2401U >> (*pbVar9 & 0x1f) & 1) == 0)) &&
       ((iVar4 = strncmp((char *)pbVar9,"HTTP/",5), iVar4 == 0 &&
        (local_58 = pbVar9 + 5, (short)(*ppuVar6)[pbVar9[5]] < 0)))) {
      (conn->response_info).http_version = (char *)local_58;
      iVar4 = skip_to_end_of_word_and_terminate((char **)&local_58,0);
      pbVar9 = local_58;
      if (((0 < iVar4) &&
          (iVar4 = skip_to_end_of_word_and_terminate((char **)&local_58,0), 0 < iVar4)) &&
         ((lVar7 = strtol((char *)pbVar9,&local_38,10), 0xfffffffffffffc7b < lVar7 - 1000U &&
          (((long)local_38 - (long)pbVar9 == 3 && (*local_38 == '\0')))))) {
        (conn->response_info).status_code = (int)lVar7;
        (conn->response_info).status_text = (char *)local_58;
        local_58 = local_58 + -1;
        do {
          bVar2 = local_58[1];
          local_58 = local_58 + 1;
        } while ((*(byte *)((long)*ppuVar6 + (ulong)bVar2 * 2 + 1) & 0x40) != 0);
        if ((bVar2 == 0xd) || (bVar2 == 10)) {
          do {
            *local_58 = 0;
            pbVar9 = local_58 + 1;
            local_58 = local_58 + 1;
          } while ((*(byte *)((long)*ppuVar6 + (ulong)*pbVar9 * 2 + 1) & 0x20) != 0);
          hdr = (conn->response_info).http_headers;
          iVar4 = parse_http_headers((char **)&local_58,hdr);
          (conn->response_info).num_headers = iVar4;
          if ((-1 < iVar4) && (0 < (int)(uVar5 + (int)uVar11))) {
            iVar4 = (conn->response_info).num_headers;
            pcVar12 = get_header(hdr,iVar4,"Transfer-Encoding");
            if (pcVar12 != (char *)0x0) {
              pp_Var8 = __ctype_tolower_loc();
              p_Var3 = *pp_Var8;
              lVar7 = 0;
              do {
                pbVar1 = (byte *)(pcVar12 + lVar7);
                pbVar9 = (byte *)("identity" + lVar7);
                if (*pbVar1 == 0) break;
                lVar7 = lVar7 + 1;
              } while (p_Var3[*pbVar1] == p_Var3[*pbVar9]);
              if (p_Var3[*pbVar1] != p_Var3[*pbVar9]) {
                lVar7 = 0;
                do {
                  pbVar1 = (byte *)(pcVar12 + lVar7);
                  pbVar9 = (byte *)("chunked" + lVar7);
                  if (*pbVar1 == 0) break;
                  lVar7 = lVar7 + 1;
                } while (p_Var3[*pbVar1] == p_Var3[*pbVar9]);
                if (p_Var3[*pbVar1] == p_Var3[*pbVar9]) {
                  conn->is_chunked = 1;
                  goto LAB_00113cd2;
                }
                pcVar12 = "Bad request";
                goto LAB_00113a22;
              }
            }
            pbVar9 = (byte *)get_header(hdr,iVar4,"Content-Length");
            if (pbVar9 == (byte *)0x0) {
              iVar4 = (conn->response_info).status_code;
              if (((99 < iVar4 - 100U) && (iVar4 != 0x130)) && (iVar4 != 0xcc)) {
                conn->content_len = -1;
                return 1;
              }
            }
            else {
              local_58 = (byte *)0x0;
              lVar10 = strtoll((char *)pbVar9,(char **)&local_58,10);
              conn->content_len = lVar10;
              if (lVar10 < 0 || local_58 == pbVar9) {
                mg_snprintf(conn,(int *)0x0,local_50,local_48,"%s","Bad request");
                *local_40 = 0x19b;
                return 0;
              }
              (conn->response_info).content_length = lVar10;
              (conn->request_info).content_length = lVar10;
              if ((conn->response_info).status_code != 0x130) {
                return 1;
              }
            }
LAB_00113cd2:
            conn->content_len = 0;
            return 1;
          }
        }
      }
    }
  }
  pcVar12 = "Bad response";
LAB_00113a22:
  mg_snprintf(conn,(int *)0x0,local_50,local_48,"%s",pcVar12);
  *local_40 = 400;
  return 0;
}

Assistant:

static int
get_response(struct mg_connection *conn, char *ebuf, size_t ebuf_len, int *err)
{
	const char *cl;

	conn->connection_type =
	    CONNECTION_TYPE_RESPONSE; /* response (valid or not) */

	if (!get_message(conn, ebuf, ebuf_len, err)) {
		return 0;
	}

	if (parse_http_response(conn->buf, conn->buf_size, &conn->response_info)
	    <= 0) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Bad response");
		*err = 400;
		return 0;
	}

	/* Message is a valid response */

	if (((cl = get_header(conn->response_info.http_headers,
	                      conn->response_info.num_headers,
	                      "Transfer-Encoding"))
	     != NULL)
	    && mg_strcasecmp(cl, "identity")) {
		if (mg_strcasecmp(cl, "chunked")) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 400;
			return 0;
		}
		conn->is_chunked = 1;
		conn->content_len = 0; /* not yet read */
	} else if ((cl = get_header(conn->response_info.http_headers,
	                            conn->response_info.num_headers,
	                            "Content-Length"))
	           != NULL) {
		char *endptr = NULL;
		conn->content_len = strtoll(cl, &endptr, 10);
		if ((endptr == cl) || (conn->content_len < 0)) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 411;
			return 0;
		}
		/* Publish the content length back to the response info. */
		conn->response_info.content_length = conn->content_len;

		/* TODO: check if it is still used in response_info */
		conn->request_info.content_length = conn->content_len;

		/* TODO: we should also consider HEAD method */
		if (conn->response_info.status_code == 304) {
			conn->content_len = 0;
		}
	} else {
		/* TODO: we should also consider HEAD method */
		if (((conn->response_info.status_code >= 100)
		     && (conn->response_info.status_code <= 199))
		    || (conn->response_info.status_code == 204)
		    || (conn->response_info.status_code == 304)) {
			conn->content_len = 0;
		} else {
			conn->content_len = -1; /* unknown content length */
		}
	}

	return 1;
}